

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

char * dpfb::args::varNameToArgName(char *name)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcStack_10;
  char c;
  char *name_local;
  
  if ((varNameToArgName(char_const*)::nameStr_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&varNameToArgName(char_const*)::nameStr_abi_cxx11_), iVar2 != 0))
  {
    std::__cxx11::string::string((string *)varNameToArgName(char_const*)::nameStr_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,varNameToArgName(char_const*)::nameStr_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&varNameToArgName(char_const*)::nameStr_abi_cxx11_);
  }
  std::__cxx11::string::clear();
  std::__cxx11::string::operator+=((string *)varNameToArgName(char_const*)::nameStr_abi_cxx11_,'-');
  pcStack_10 = name;
  while (*pcStack_10 != '\0') {
    cVar1 = *pcStack_10;
    pcStack_10 = pcStack_10 + 1;
    iVar2 = isupper((int)cVar1);
    if (iVar2 == 0) {
      std::__cxx11::string::operator+=
                ((string *)varNameToArgName(char_const*)::nameStr_abi_cxx11_,cVar1);
    }
    else {
      std::__cxx11::string::operator+=
                ((string *)varNameToArgName(char_const*)::nameStr_abi_cxx11_,'-');
      iVar2 = tolower((int)cVar1);
      std::__cxx11::string::operator+=
                ((string *)varNameToArgName(char_const*)::nameStr_abi_cxx11_,(char)iVar2);
    }
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  return pcVar3;
}

Assistant:

static const char* varNameToArgName(const char* name)
{
    static std::string nameStr;
    nameStr.clear();

    nameStr += '-';

    while (*name) {
        const auto c = *name;
        ++name;

        if (std::isupper(c)) {
            nameStr += '-';
            nameStr += std::tolower(c);
        } else
            nameStr += c;
    }

    return nameStr.c_str();
}